

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O2

void __thiscall nuraft::nuraft_global_mgr::init_thread_pool(nuraft_global_mgr *this)

{
  atomic<unsigned_long> *paVar1;
  size_t ii;
  ulong uVar2;
  undefined1 local_68 [8];
  ptr<worker_handle> w_hdl;
  nuraft_global_mgr *local_50;
  undefined8 local_48;
  __shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  for (uVar2 = 0; uVar2 < (this->config_).num_commit_threads_; uVar2 = uVar2 + 1) {
    LOCK();
    paVar1 = &this->thread_id_counter_;
    local_40._M_ptr = (element_type *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    std::make_shared<nuraft::nuraft_global_mgr::worker_handle,unsigned_long>
              ((unsigned_long *)&w_hdl);
    local_50 = (nuraft_global_mgr *)commit_worker_loop;
    local_48 = 0;
    local_68 = (undefined1  [8])this;
    std::
    make_shared<std::thread,void(nuraft::nuraft_global_mgr::*)(std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>),nuraft::nuraft_global_mgr*,std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>&>
              ((type *)&local_40,&local_50,
               (shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)local_68);
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((w_hdl.
                  super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::
    vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
    ::push_back(&this->commit_workers_,&w_hdl);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&w_hdl.
                super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  for (uVar2 = 0; uVar2 < (this->config_).num_append_threads_; uVar2 = uVar2 + 1) {
    LOCK();
    paVar1 = &this->thread_id_counter_;
    local_40._M_ptr = (element_type *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    std::make_shared<nuraft::nuraft_global_mgr::worker_handle,unsigned_long>
              ((unsigned_long *)&w_hdl);
    local_50 = (nuraft_global_mgr *)append_worker_loop;
    local_48 = 0;
    local_68 = (undefined1  [8])this;
    std::
    make_shared<std::thread,void(nuraft::nuraft_global_mgr::*)(std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>),nuraft::nuraft_global_mgr*,std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>&>
              ((type *)&local_40,&local_50,
               (shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)local_68);
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((w_hdl.
                  super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::
    vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
    ::push_back(&this->append_workers_,&w_hdl);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&w_hdl.
                super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

void nuraft_global_mgr::init_thread_pool() {
    for (size_t ii = 0; ii < config_.num_commit_threads_; ++ii) {
        ptr<worker_handle> w_hdl =
            cs_new<worker_handle>( thread_id_counter_.fetch_add(1) );
        w_hdl->thread_ = cs_new<std::thread>( &nuraft_global_mgr::commit_worker_loop,
                                              this,
                                              w_hdl );
        commit_workers_.push_back(w_hdl);
    }

    for (size_t ii = 0; ii < config_.num_append_threads_; ++ii) {
        ptr<worker_handle> w_hdl =
            cs_new<worker_handle>( thread_id_counter_.fetch_add(1) );
        w_hdl->thread_ = cs_new<std::thread>( &nuraft_global_mgr::append_worker_loop,
                                              this,
                                              w_hdl );
        append_workers_.push_back(w_hdl);
    }
}